

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.c
# Opt level: O0

uint64_t getNumBlocks(uint64_t input_length,SkeinSize_t state_size)

{
  undefined4 local_24;
  uint64_t uStack_20;
  uint32_t bytes;
  uint64_t blocks;
  SkeinSize_t state_size_local;
  uint64_t input_length_local;
  
  uStack_20 = 0;
  for (local_24 = 0; local_24 < input_length; local_24 = (state_size >> 3) + local_24) {
    uStack_20 = uStack_20 + 1;
  }
  return uStack_20;
}

Assistant:

inline uint64_t getNumBlocks(const uint64_t input_length, const SkeinSize_t state_size)
{
    uint64_t blocks = 0;
    uint32_t bytes = 0;
    while(bytes < input_length)
    {
        bytes += (uint32_t) state_size/8;
        blocks++;
    }

    return blocks;
}